

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

int __thiscall TPZSkylMatrix<double>::Subst_Diag(TPZSkylMatrix<double> *this,TPZFMatrix<double> *B)

{
  double **ppdVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  int extraout_var_00;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar5;
  
  lVar5 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  iVar3 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  iVar4 = 0;
  if ((lVar5 == CONCAT44(extraout_var,iVar3)) &&
     (iVar4 = 0, (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed == '\x04')) {
    iVar4 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0xc])(this);
    lVar5 = CONCAT44(extraout_var_00,iVar4);
    iVar4 = 1;
    if ((lVar5 != 0) && (0 < (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      lVar9 = 0;
      lVar8 = 0;
      do {
        if ((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (lVar5 != 0 && -1 < extraout_var_00) {
          ppdVar1 = (this->fElem).fStore;
          lVar6 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar9;
          pdVar2 = B->fElem;
          lVar7 = 0;
          do {
            *(double *)((long)pdVar2 + lVar7 * 8 + lVar6) =
                 *(double *)((long)pdVar2 + lVar7 * 8 + lVar6) / *ppdVar1[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar5 != lVar7);
        }
        lVar8 = lVar8 + 1;
        lVar9 = lVar9 + 8;
      } while (lVar8 < (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
    }
  }
  return iVar4;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const {
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ELDLt) return( 0 );
    int64_t dimension = this->Dim();
    if (!dimension) {
        return 1;
    }
    for ( int64_t j = 0; j < B->Cols(); j++ ) {
        TVar *BPtr = &(*B)(0,j);
        int64_t k=0;
        while(k < dimension) *BPtr++ /= *(fElem[k++]);
    }
    return( 1 );
}